

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::MessageFieldGenerator
          (MessageFieldGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  FieldDescriptor *in_RCX;
  FieldGenerator *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000458;
  undefined1 in_stack_00000467;
  Options *in_stack_00000468;
  FieldDescriptor *in_stack_00000470;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Options *in_stack_ffffffffffffffd8;
  
  FieldGenerator::FieldGenerator(in_RDI,in_stack_ffffffffffffffb8,(Options *)0x56c141);
  in_RDI->_vptr_FieldGenerator = (_func_int **)&PTR__MessageFieldGenerator_008965f8;
  bVar1 = IsImplicitWeakField(in_RCX,in_stack_ffffffffffffffd8,
                              (MessageSCCAnalyzer *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(bool *)&in_RDI[1]._vptr_FieldGenerator = bVar1;
  anon_unknown_5::SetMessageVariables
            (in_stack_00000470,in_stack_00000468,(bool)in_stack_00000467,in_stack_00000458);
  return;
}

Assistant:

MessageFieldGenerator::MessageFieldGenerator(const FieldDescriptor* descriptor,
                                             const Options& options,
                                             MessageSCCAnalyzer* scc_analyzer)
    : FieldGenerator(descriptor, options),
      implicit_weak_field_(
          IsImplicitWeakField(descriptor, options, scc_analyzer)) {
  SetMessageVariables(descriptor, options, implicit_weak_field_, &variables_);
}